

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O2

void OptPrint(void)

{
  option_type oVar1;
  char *__s;
  int iVar2;
  FILE *__stream;
  size_t sVar3;
  uint uVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  char *__format;
  undefined8 uVar9;
  s_options *psVar10;
  char **ppcVar11;
  
  psVar10 = op;
  ppcVar11 = &op->label;
  uVar7 = 0;
  while( true ) {
    iVar6 = (int)uVar7;
    if (*ppcVar11 == (char *)0x0) break;
    sVar3 = strlen(*ppcVar11);
    iVar2 = (int)sVar3;
    uVar4 = iVar2 + 1;
    oVar1 = ((s_options *)(ppcVar11 + -1))->type;
    if (oVar1 < (OPT_FSTR|OPT_FLAG)) {
      if ((0x44U >> (oVar1 & 0x1f) & 1) == 0) {
        if ((0x88U >> (oVar1 & 0x1f) & 1) == 0) {
          if ((0x110U >> (oVar1 & 0x1f) & 1) != 0) {
            uVar4 = iVar2 + 9;
          }
        }
        else {
          uVar4 = iVar2 + 7;
        }
      }
      else {
        uVar4 = iVar2 + 10;
      }
    }
    if (iVar6 < (int)uVar4) {
      uVar7 = (ulong)uVar4;
    }
    ppcVar11 = ppcVar11 + 4;
  }
  lVar8 = 0x18;
  do {
    __stream = errstream;
    __s = *(char **)((long)psVar10 + lVar8 + -0x10);
    if (__s == (char *)0x0) {
      return;
    }
    switch(*(undefined4 *)((long)psVar10 + lVar8 + -0x18)) {
    case 1:
    case 5:
      fprintf((FILE *)errstream,"  -%-*s  %s\n",uVar7,__s,
              *(undefined8 *)((long)&psVar10->type + lVar8));
      goto switchD_00108ec7_default;
    case 2:
    case 6:
      sVar3 = strlen(__s);
      uVar5 = (ulong)(uint)((iVar6 + -9) - (int)sVar3);
      uVar9 = *(undefined8 *)((long)&psVar10->type + lVar8);
      __format = "  -%s<integer>%*s  %s\n";
      break;
    case 3:
    case 7:
      sVar3 = strlen(__s);
      uVar5 = (ulong)(uint)((iVar6 + -6) - (int)sVar3);
      uVar9 = *(undefined8 *)((long)&psVar10->type + lVar8);
      __format = "  -%s<real>%*s  %s\n";
      break;
    case 4:
    case 8:
      sVar3 = strlen(__s);
      uVar5 = (ulong)(uint)((iVar6 + -8) - (int)sVar3);
      uVar9 = *(undefined8 *)((long)&psVar10->type + lVar8);
      __format = "  -%s<string>%*s  %s\n";
      break;
    default:
      goto switchD_00108ec7_default;
    }
    fprintf((FILE *)__stream,__format,__s,uVar5,"",uVar9);
switchD_00108ec7_default:
    lVar8 = lVar8 + 0x20;
    psVar10 = op;
  } while( true );
}

Assistant:

void OptPrint(void){
  int i;
  int max, len;
  max = 0;
  for(i=0; op[i].label; i++){
    len = lemonStrlen(op[i].label) + 1;
    switch( op[i].type ){
      case OPT_FLAG:
      case OPT_FFLAG:
        break;
      case OPT_INT:
      case OPT_FINT:
        len += 9;       /* length of "<integer>" */
        break;
      case OPT_DBL:
      case OPT_FDBL:
        len += 6;       /* length of "<real>" */
        break;
      case OPT_STR:
      case OPT_FSTR:
        len += 8;       /* length of "<string>" */
        break;
    }
    if( len>max ) max = len;
  }
  for(i=0; op[i].label; i++){
    switch( op[i].type ){
      case OPT_FLAG:
      case OPT_FFLAG:
        fprintf(errstream,"  -%-*s  %s\n",max,op[i].label,op[i].message);
        break;
      case OPT_INT:
      case OPT_FINT:
        fprintf(errstream,"  -%s<integer>%*s  %s\n",op[i].label,
          (int)(max-lemonStrlen(op[i].label)-9),"",op[i].message);
        break;
      case OPT_DBL:
      case OPT_FDBL:
        fprintf(errstream,"  -%s<real>%*s  %s\n",op[i].label,
          (int)(max-lemonStrlen(op[i].label)-6),"",op[i].message);
        break;
      case OPT_STR:
      case OPT_FSTR:
        fprintf(errstream,"  -%s<string>%*s  %s\n",op[i].label,
          (int)(max-lemonStrlen(op[i].label)-8),"",op[i].message);
        break;
    }
  }
}